

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::Imputer::_InternalParse(Imputer *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  ParseContext *this_00;
  bool bVar1;
  DoubleVector *msg;
  Int64Vector *msg_00;
  StringToDoubleMap *msg_01;
  Int64ToDoubleMap *msg_02;
  uint64_t uVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  double dVar4;
  string *str_1;
  string *str;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  Imputer *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
LAB_0025321c:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)
                google::protobuf::internal::ReadTag
                          ((char *)ctx_local,(uint32_t *)((long)&str + 4),0);
    this_00 = pPStack_20;
    tag_00 = str._4_4_;
    switch(str._4_4_ >> 3) {
    case 1:
      if ((str._4_4_ & 0xff) == 9) {
        dVar4 = google::protobuf::internal::UnalignedLoad<double>((char *)ctx_local);
        _internal_set_imputeddoublevalue(this,dVar4);
        ctx_local = (ParseContext *)&(ctx_local->super_EpsCopyInputStream).buffer_end_;
        goto LAB_0025321c;
      }
      break;
    case 2:
      if ((str._4_4_ & 0xff) != 0x10) break;
      uVar2 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
      _internal_set_imputedint64value(this,uVar2);
      goto joined_r0x0025355a;
    case 3:
      if ((str._4_4_ & 0xff) == 0x1a) {
        psVar3 = _internal_mutable_imputedstringvalue_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar3,(char *)ctx_local,pPStack_20);
        bVar1 = google::protobuf::internal::VerifyUTF8(psVar3,(char *)0x0);
joined_r0x00253545:
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return (char *)(ParseContext *)0x0;
        }
        goto joined_r0x0025355a;
      }
      break;
    case 4:
      if ((str._4_4_ & 0xff) == 0x22) {
        msg = _internal_mutable_imputeddoublearray(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::ParseContext::ParseMessage
                              (this_00,&msg->super_MessageLite,(char *)ctx_local);
        goto joined_r0x0025355a;
      }
      break;
    case 5:
      if ((str._4_4_ & 0xff) == 0x2a) {
        msg_00 = _internal_mutable_imputedint64array(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::ParseContext::ParseMessage
                              (this_00,&msg_00->super_MessageLite,(char *)ctx_local);
        goto joined_r0x0025355a;
      }
      break;
    case 6:
      if ((str._4_4_ & 0xff) == 0x32) {
        msg_01 = _internal_mutable_imputedstringdictionary(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::ParseContext::ParseMessage
                              (this_00,&msg_01->super_MessageLite,(char *)ctx_local);
        goto joined_r0x0025355a;
      }
      break;
    case 7:
      if ((str._4_4_ & 0xff) == 0x3a) {
        msg_02 = _internal_mutable_imputedint64dictionary(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::ParseContext::ParseMessage
                              (this_00,&msg_02->super_MessageLite,(char *)ctx_local);
        goto joined_r0x0025355a;
      }
      break;
    default:
      break;
    case 0xb:
      if ((str._4_4_ & 0xff) == 0x59) {
        dVar4 = google::protobuf::internal::UnalignedLoad<double>((char *)ctx_local);
        _internal_set_replacedoublevalue(this,dVar4);
        ctx_local = (ParseContext *)&(ctx_local->super_EpsCopyInputStream).buffer_end_;
        goto LAB_0025321c;
      }
      break;
    case 0xc:
      if ((str._4_4_ & 0xff) == 0x60) {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        _internal_set_replaceint64value(this,uVar2);
        goto joined_r0x0025355a;
      }
      break;
    case 0xd:
      if ((str._4_4_ & 0xff) == 0x6a) {
        psVar3 = _internal_mutable_replacestringvalue_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar3,(char *)ctx_local,pPStack_20);
        bVar1 = google::protobuf::internal::VerifyUTF8(psVar3,(char *)0x0);
        goto joined_r0x00253545;
      }
    }
    if ((str._4_4_ == 0) || ((str._4_4_ & 7) == 4)) {
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)(ParseContext *)0x0;
      }
      google::protobuf::internal::EpsCopyInputStream::SetLastTag
                (&pPStack_20->super_EpsCopyInputStream,str._4_4_);
      return (char *)ctx_local;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>
                        (&(this->super_MessageLite)._internal_metadata_);
    ctx_local = (ParseContext *)
                google::protobuf::internal::UnknownFieldParse
                          (tag_00,unknown,(char *)ctx_local,pPStack_20);
joined_r0x0025355a:
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)(ParseContext *)0x0;
    }
  } while( true );
}

Assistant:

const char* Imputer::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // double imputedDoubleValue = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 9)) {
          _internal_set_imputeddoublevalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      // int64 imputedInt64Value = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          _internal_set_imputedint64value(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string imputedStringValue = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          auto str = _internal_mutable_imputedstringvalue();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.DoubleVector imputedDoubleArray = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_imputeddoublearray(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Vector imputedInt64Array = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_imputedint64array(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.StringToDoubleMap imputedStringDictionary = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 50)) {
          ptr = ctx->ParseMessage(_internal_mutable_imputedstringdictionary(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64ToDoubleMap imputedInt64Dictionary = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 58)) {
          ptr = ctx->ParseMessage(_internal_mutable_imputedint64dictionary(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // double replaceDoubleValue = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 89)) {
          _internal_set_replacedoublevalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      // int64 replaceInt64Value = 12;
      case 12:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 96)) {
          _internal_set_replaceint64value(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string replaceStringValue = 13;
      case 13:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 106)) {
          auto str = _internal_mutable_replacestringvalue();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}